

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O2

uint8_t * __thiscall
Lodtalk::MethodAssembler::PushLiteralVariable::encode(PushLiteralVariable *this,uint8_t *buffer)

{
  uint uVar1;
  uint8_t *puVar2;
  
  uVar1 = this->index;
  if ((int)uVar1 < 0x10) {
    *buffer = (char)uVar1 + '\x10';
    puVar2 = buffer + 1;
  }
  else {
    InstructionNode::encodeExtA(&this->super_InstructionNode,buffer,(ulong)(uVar1 >> 8));
    *buffer = 0xe3;
    buffer[1] = (uint8_t)this->index;
    puVar2 = buffer + 2;
  }
  return puVar2;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
		if(index < BytecodeSet::PushLiteralVariableShortRangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::PushLiteralVariableShortFirst + index);
			return buffer;
		}

        buffer = encodeExtA(buffer, index / 256);
        *buffer++ = BytecodeSet::PushLiteralVariable;
        *buffer++ = index % 256;
        return buffer;
	}